

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::Load<unsigned_short>(Memory *this,u64 offset,u64 addend,unsigned_short *out)

{
  bool bVar1;
  
  bVar1 = IsValidAccess(this,offset,addend,2);
  if (bVar1) {
    *out = *(unsigned_short *)
            ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + addend + offset);
  }
  return (Result)(uint)!bVar1;
}

Assistant:

Result Memory::Load(u64 offset, u64 addend, T* out) const {
  if (!IsValidAccess(offset, addend, sizeof(T))) {
    return Result::Error;
  }
  MemcpyEndianAware(out, data_.data(), sizeof(T), data_.size(), 0,
                    offset + addend, sizeof(T));
  return Result::Ok;
}